

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall QPDFJob::showEncryption(QPDFJob *this,QPDF *pdf)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *this_00;
  Pipeline *pPVar4;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  undefined1 local_88 [8];
  string encryption_key;
  string user_password;
  element_type *cout;
  encryption_method_e file_method;
  encryption_method_e string_method;
  encryption_method_e stream_method;
  int V;
  int P;
  int R;
  QPDF *pdf_local;
  QPDFJob *this_local;
  
  V = 0;
  stream_method = e_none;
  string_method = e_none;
  file_method = e_unknown;
  cout._4_4_ = e_unknown;
  cout._0_4_ = e_unknown;
  _P = pdf;
  pdf_local = (QPDF *)this;
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar3 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      peVar2);
  QPDFLogger::getInfo((QPDFLogger *)((long)&user_password.field_2 + 8),SUB81(peVar3,0));
  this_00 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                      ((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       (user_password.field_2._M_local_buf + 8));
  std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)((long)&user_password.field_2 + 8))
  ;
  bVar1 = QPDF::isEncrypted(_P,&V,(int *)&stream_method,(int *)&string_method,&file_method,
                            (encryption_method_e *)((long)&cout + 4),(encryption_method_e *)&cout);
  if (bVar1) {
    pPVar4 = Pipeline::operator<<(this_00,"R = ");
    pPVar4 = Pipeline::operator<<(pPVar4,V);
    Pipeline::operator<<(pPVar4,"\n");
    pPVar4 = Pipeline::operator<<(this_00,"P = ");
    pPVar4 = Pipeline::operator<<(pPVar4,stream_method);
    Pipeline::operator<<(pPVar4,"\n");
    QPDF::getTrimmedUserPassword_abi_cxx11_((string *)((long)&encryption_key.field_2 + 8),_P);
    QPDF::getEncryptionKey_abi_cxx11_((string *)local_88,_P);
    pPVar4 = Pipeline::operator<<(this_00,"User password = ");
    pPVar4 = Pipeline::operator<<(pPVar4,(string *)((long)&encryption_key.field_2 + 8));
    Pipeline::operator<<(pPVar4,"\n");
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    if ((peVar2->show_encryption_key & 1U) != 0) {
      pPVar4 = Pipeline::operator<<(this_00,"Encryption key = ");
      QUtil::hex_encode(&local_b8,(string *)local_88);
      pPVar4 = Pipeline::operator<<(pPVar4,&local_b8);
      Pipeline::operator<<(pPVar4,"\n");
      std::__cxx11::string::~string((string *)&local_b8);
    }
    bVar1 = QPDF::ownerPasswordMatched(_P);
    if (bVar1) {
      Pipeline::operator<<(this_00,"Supplied password is owner password\n");
    }
    bVar1 = QPDF::userPasswordMatched(_P);
    if (bVar1) {
      Pipeline::operator<<(this_00,"Supplied password is user password\n");
    }
    pPVar4 = Pipeline::operator<<(this_00,"extract for accessibility: ");
    bVar1 = QPDF::allowAccessibility(_P);
    show_bool_abi_cxx11_(&local_d8,bVar1);
    pPVar4 = Pipeline::operator<<(pPVar4,&local_d8);
    pPVar4 = Pipeline::operator<<(pPVar4,"\n");
    pPVar4 = Pipeline::operator<<(pPVar4,"extract for any purpose: ");
    bVar1 = QPDF::allowExtractAll(_P);
    show_bool_abi_cxx11_(&local_f8,bVar1);
    pPVar4 = Pipeline::operator<<(pPVar4,&local_f8);
    pPVar4 = Pipeline::operator<<(pPVar4,"\n");
    pPVar4 = Pipeline::operator<<(pPVar4,"print low resolution: ");
    bVar1 = QPDF::allowPrintLowRes(_P);
    show_bool_abi_cxx11_(&local_118,bVar1);
    pPVar4 = Pipeline::operator<<(pPVar4,&local_118);
    pPVar4 = Pipeline::operator<<(pPVar4,"\n");
    pPVar4 = Pipeline::operator<<(pPVar4,"print high resolution: ");
    bVar1 = QPDF::allowPrintHighRes(_P);
    show_bool_abi_cxx11_(&local_138,bVar1);
    pPVar4 = Pipeline::operator<<(pPVar4,&local_138);
    pPVar4 = Pipeline::operator<<(pPVar4,"\n");
    pPVar4 = Pipeline::operator<<(pPVar4,"modify document assembly: ");
    bVar1 = QPDF::allowModifyAssembly(_P);
    show_bool_abi_cxx11_(&local_158,bVar1);
    pPVar4 = Pipeline::operator<<(pPVar4,&local_158);
    pPVar4 = Pipeline::operator<<(pPVar4,"\n");
    pPVar4 = Pipeline::operator<<(pPVar4,"modify forms: ");
    bVar1 = QPDF::allowModifyForm(_P);
    show_bool_abi_cxx11_(&local_178,bVar1);
    pPVar4 = Pipeline::operator<<(pPVar4,&local_178);
    pPVar4 = Pipeline::operator<<(pPVar4,"\n");
    pPVar4 = Pipeline::operator<<(pPVar4,"modify annotations: ");
    bVar1 = QPDF::allowModifyAnnotation(_P);
    show_bool_abi_cxx11_(&local_198,bVar1);
    pPVar4 = Pipeline::operator<<(pPVar4,&local_198);
    pPVar4 = Pipeline::operator<<(pPVar4,"\n");
    pPVar4 = Pipeline::operator<<(pPVar4,"modify other: ");
    bVar1 = QPDF::allowModifyOther(_P);
    show_bool_abi_cxx11_(&local_1b8,bVar1);
    pPVar4 = Pipeline::operator<<(pPVar4,&local_1b8);
    pPVar4 = Pipeline::operator<<(pPVar4,"\n");
    pPVar4 = Pipeline::operator<<(pPVar4,"modify anything: ");
    bVar1 = QPDF::allowModifyAll(_P);
    show_bool_abi_cxx11_(&local_1d8,bVar1);
    pPVar4 = Pipeline::operator<<(pPVar4,&local_1d8);
    Pipeline::operator<<(pPVar4,"\n");
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d8);
    if (3 < (int)string_method) {
      pPVar4 = Pipeline::operator<<(this_00,"stream encryption method: ");
      show_encryption_method_abi_cxx11_(&local_1f8,file_method);
      pPVar4 = Pipeline::operator<<(pPVar4,&local_1f8);
      pPVar4 = Pipeline::operator<<(pPVar4,"\n");
      pPVar4 = Pipeline::operator<<(pPVar4,"string encryption method: ");
      show_encryption_method_abi_cxx11_(&local_218,cout._4_4_);
      pPVar4 = Pipeline::operator<<(pPVar4,&local_218);
      pPVar4 = Pipeline::operator<<(pPVar4,"\n");
      pPVar4 = Pipeline::operator<<(pPVar4,"file encryption method: ");
      show_encryption_method_abi_cxx11_(&local_238,(encryption_method_e)cout);
      pPVar4 = Pipeline::operator<<(pPVar4,&local_238);
      Pipeline::operator<<(pPVar4,"\n");
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_1f8);
    }
    std::__cxx11::string::~string((string *)local_88);
    std::__cxx11::string::~string((string *)(encryption_key.field_2._M_local_buf + 8));
  }
  else {
    Pipeline::operator<<(this_00,"File is not encrypted\n");
  }
  return;
}

Assistant:

void
QPDFJob::showEncryption(QPDF& pdf)
{
    // Extract /P from /Encrypt
    int R = 0;
    int P = 0;
    int V = 0;
    QPDF::encryption_method_e stream_method = QPDF::e_unknown;
    QPDF::encryption_method_e string_method = QPDF::e_unknown;
    QPDF::encryption_method_e file_method = QPDF::e_unknown;
    auto& cout = *m->log->getInfo();
    if (!pdf.isEncrypted(R, P, V, stream_method, string_method, file_method)) {
        cout << "File is not encrypted\n";
    } else {
        cout << "R = " << R << "\n";
        cout << "P = " << P << "\n";
        std::string user_password = pdf.getTrimmedUserPassword();
        std::string encryption_key = pdf.getEncryptionKey();
        cout << "User password = " << user_password << "\n";
        if (m->show_encryption_key) {
            cout << "Encryption key = " << QUtil::hex_encode(encryption_key) << "\n";
        }
        if (pdf.ownerPasswordMatched()) {
            cout << "Supplied password is owner password\n";
        }
        if (pdf.userPasswordMatched()) {
            cout << "Supplied password is user password\n";
        }
        cout << "extract for accessibility: " << show_bool(pdf.allowAccessibility()) << "\n"
             << "extract for any purpose: " << show_bool(pdf.allowExtractAll()) << "\n"
             << "print low resolution: " << show_bool(pdf.allowPrintLowRes()) << "\n"
             << "print high resolution: " << show_bool(pdf.allowPrintHighRes()) << "\n"
             << "modify document assembly: " << show_bool(pdf.allowModifyAssembly()) << "\n"
             << "modify forms: " << show_bool(pdf.allowModifyForm()) << "\n"
             << "modify annotations: " << show_bool(pdf.allowModifyAnnotation()) << "\n"
             << "modify other: " << show_bool(pdf.allowModifyOther()) << "\n"
             << "modify anything: " << show_bool(pdf.allowModifyAll()) << "\n";
        if (V >= 4) {
            cout << "stream encryption method: " << show_encryption_method(stream_method) << "\n"
                 << "string encryption method: " << show_encryption_method(string_method) << "\n"
                 << "file encryption method: " << show_encryption_method(file_method) << "\n";
        }
    }
}